

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O0

void __thiscall
jess_unicode_case_folding_txt_Test::~jess_unicode_case_folding_txt_Test
          (jess_unicode_case_folding_txt_Test *this)

{
  jess_unicode_case_folding_txt_Test *this_local;
  
  ~jess_unicode_case_folding_txt_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(jess, unicode_case_folding_txt) {
	auto folded_codepoints = read_CaseFolding_txt();
	ASSERT_FALSE(folded_codepoints.empty());

	// Test that every folded codepoint is equal to its folded equivalent
	for (auto& folded_codepoint : folded_codepoints) {
		EXPECT_EQ(jessilib::fold(folded_codepoint.in_codepoint), folded_codepoint.out_codepoint)
			<< std::hex << std::uppercase << "lhs: " << std::setw(4) << folded_codepoint.in_codepoint << "; rhs: " << std::setw(8) << folded_codepoint.out_codepoint;
		EXPECT_TRUE(jessilib::equalsi(folded_codepoint.in_codepoint, folded_codepoint.out_codepoint));
	}

	// If the above failed, print out what the fold table needs to be replaced with
	if (::testing::Test::HasFailure()) {
		auto folding_sets = folding_sets_from_folding_info(folded_codepoints);
		ASSERT_FALSE(folding_sets.empty());
		for (auto& set : folding_sets) {
			// Generate code in the format: { folding_set::mode_type::constant, 0x1234, 0x2345, 1 },
			std::cout << std::hex << std::uppercase << std::setfill('0') << "{ "
				<< "folding_set::mode_type::" << set.type()
				<< ", "
				<< "0x" << std::setw(4) << set.range_start << ", "
				<< "0x" << std::setw(4) << set.range_end << ", "
				<< std::dec << set.diff
				<< " }," << std::endl;
		}

		std::cout << "folded_codepoints.size(): " << folded_codepoints.size() << "; folding_sets.size(): " << folding_sets.size() << std::endl;
	}

	// Test that every non-folded codepoint in [0, 0xFFFF] is equal to itself; we already tested folded ones above
	for (char32_t codepoint = 0; codepoint != 0x10000; ++codepoint) {
		bool is_folded = std::binary_search(folded_codepoints.begin(), folded_codepoints.end(), codepoint);
		if (!is_folded) {
			EXPECT_EQ(codepoint, jessilib::fold(codepoint));
			EXPECT_TRUE(jessilib::equalsi(codepoint, codepoint));
		}
	}
}